

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImgDisplay * __thiscall cimg_library::CImgDisplay::move(CImgDisplay *this,int posx,int posy)

{
  Display *pDVar1;
  bool bVar2;
  X11_info *pXVar3;
  Display *dpy;
  int posy_local;
  int posx_local;
  CImgDisplay *this_local;
  
  bVar2 = is_empty(this);
  this_local = this;
  if (!bVar2) {
    show(this);
    pXVar3 = cimg::X11_attr();
    pDVar1 = pXVar3->display;
    XLockDisplay(pDVar1);
    XMoveWindow(pDVar1,this->_window,posx,posy);
    this->_window_x = posx;
    this->_window_y = posy;
    this->_is_moved = false;
    XUnlockDisplay(pDVar1);
    this_local = paint(this,true);
  }
  return this_local;
}

Assistant:

CImgDisplay& move(const int posx, const int posy) {
      if (is_empty()) return *this;
      show();
      Display *const dpy = cimg::X11_attr().display;
      XLockDisplay(dpy);
      XMoveWindow(dpy,_window,posx,posy);
      _window_x = posx; _window_y = posy;
      _is_moved = false;
      XUnlockDisplay(dpy);
      return paint();
    }